

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O1

void __thiscall iutest::TestEnv::Variable::~Variable(Variable *this)

{
  pointer pcVar1;
  pointer ppTVar2;
  pointer ppEVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  pcVar1 = (this->m_locale_ctype)._M_dataplus._M_p;
  paVar4 = &(this->m_locale_ctype).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->m_ostream_formatter);
  std::ios_base::~ios_base((ios_base *)&(this->m_ostream_formatter).field_0x80);
  (this->m_event_listeners).m_repeater.super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__TestEventRepeater_001364b0;
  ppTVar2 = (this->m_event_listeners).m_repeater.m_listeners.
            super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2,(long)(this->m_event_listeners).m_repeater.m_listeners.
                                  super__Vector_base<iutest::TestEventListener_*,_std::allocator<iutest::TestEventListener_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2
                   );
  }
  ppEVar3 = (this->m_environment_list).
            super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar3 != (pointer)0x0) {
    operator_delete(ppEVar3,(long)(this->m_environment_list).
                                  super__Vector_base<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar3
                   );
  }
  pcVar1 = (this->m_default_package_name)._M_dataplus._M_p;
  paVar4 = &(this->m_default_package_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_stream_result_to).m_value._M_dataplus._M_p;
  paVar4 = &(this->m_stream_result_to).m_value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_flagfile)._M_dataplus._M_p;
  paVar4 = &(this->m_flagfile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_test_filter)._M_dataplus._M_p;
  paVar4 = &(this->m_test_filter).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_output_option).m_value._M_dataplus._M_p;
  paVar4 = &(this->m_output_option).m_value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Variable()
            : m_random_seed(0)
            , m_current_random_seed(0)
            , m_before_origin_random_seed(0)
            , m_repeat_count(1)
            , m_testpartresult_reporter(NULL)
        {}